

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_surface_mesh.cpp
# Opt level: O3

VertexData<Vertex> * __thiscall
geometrycentral::surface::ManifoldSurfaceMesh::separateNonmanifoldVertices
          (VertexData<Vertex> *__return_storage_ptr__,ManifoldSurfaceMesh *this)

{
  size_t sVar1;
  pointer puVar2;
  Vertex *pVVar3;
  long lVar4;
  size_t sVar5;
  
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::Vertex>::MeshData
            (__return_storage_ptr__,&this->super_SurfaceMesh);
  sVar1 = (this->super_SurfaceMesh).nVerticesFillCount;
  if ((sVar1 == 0) ||
     (puVar2 = (this->super_SurfaceMesh).vHalfedgeArr.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar2 != 0xffffffffffffffff)) {
    sVar5 = 0;
  }
  else {
    sVar5 = 0;
    do {
      if (sVar1 - 1 == sVar5) {
        return __return_storage_ptr__;
      }
      lVar4 = sVar5 + 1;
      sVar5 = sVar5 + 1;
    } while (puVar2[lVar4] == 0xffffffffffffffff);
  }
  if (sVar5 != sVar1) {
    do {
      pVVar3 = (__return_storage_ptr__->data).
               super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Vertex,__1,_1,_0,__1,_1>_>
               .m_storage.m_data;
      pVVar3[sVar5].
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
           &this->super_SurfaceMesh;
      pVVar3[sVar5].
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
           sVar5;
      do {
        if (sVar1 - 1 == sVar5) {
          return __return_storage_ptr__;
        }
        lVar4 = sVar5 + 1;
        sVar5 = sVar5 + 1;
      } while ((this->super_SurfaceMesh).vHalfedgeArr.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar4] == 0xffffffffffffffff);
    } while (sVar1 != sVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

VertexData<Vertex> ManifoldSurfaceMesh::separateNonmanifoldVertices() {
  VertexData<Vertex> parents(*this);
  for (Vertex v : vertices()) parents[v] = v;
  return parents;
}